

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.cpp
# Opt level: O2

void __thiscall antlr::BitSet::add(BitSet *this,uint el)

{
  reference rVar1;
  
  if ((ulong)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(this->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <= (ulong)el) {
    std::vector<bool,_std::allocator<bool>_>::resize(&this->storage,(ulong)(el + 1),false);
  }
  rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->storage,(ulong)el);
  *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
  return;
}

Assistant:

void BitSet::add(unsigned int el)
{
	if( el >= storage.size() )
		storage.resize( el+1, false );

	storage[el] = true;
}